

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyGlobals.cpp
# Opt level: O0

bool __thiscall wasm::SimplifyGlobals::removeUnneededWrites(SimplifyGlobals *this)

{
  byte bVar1;
  bool bVar2;
  __int_type_conflict1 _Var3;
  __int_type_conflict1 _Var4;
  vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  *this_00;
  pointer pGVar5;
  PassRunner *runner;
  pair<std::_Rb_tree_const_iterator<wasm::Name>,_bool> pVar6;
  GlobalSetRemover local_1d0;
  _Base_ptr local_90;
  undefined1 local_88;
  byte local_7d;
  bool onlyReadOnlyToWrite;
  mapped_type *local_70;
  mapped_type *info;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *global;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  *__range2;
  NameSet globalsNotNeedingSets;
  bool more;
  SimplifyGlobals *this_local;
  
  globalsNotNeedingSets._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
  std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::set
            ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)&__range2);
  this_00 = &this->module->globals;
  __end2 = std::
           vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ::begin(this_00);
  global = (unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
           std::
           vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ::end(this_00);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
                                *)&global);
    if (!bVar2) {
      anon_unknown_163::GlobalSetRemover::GlobalSetRemover
                (&local_1d0,(NameSet *)&__range2,(bool)(this->optimize & 1));
      runner = Pass::getPassRunner(&this->super_Pass);
      WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GlobalSetRemover,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalSetRemover,_void>_>_>
      ::run(&local_1d0.
             super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GlobalSetRemover,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalSetRemover,_void>_>_>
            ,runner,this->module);
      anon_unknown_163::GlobalSetRemover::~GlobalSetRemover(&local_1d0);
      bVar1 = globalsNotNeedingSets._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_;
      std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::~set
                ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)&__range2);
      return (bool)(bVar1 & 1);
    }
    info = (mapped_type *)
           __gnu_cxx::
           __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
           ::operator*(&__end2);
    pGVar5 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                       ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)info);
    local_70 = std::
               map<wasm::Name,_wasm::(anonymous_namespace)::GlobalInfo,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::GlobalInfo>_>_>
               ::operator[](&this->map,(key_type *)pGVar5);
    _Var3 = std::__atomic_base::operator_cast_to_unsigned_int((__atomic_base *)&local_70->written);
    if (((_Var3 != 0) && ((local_70->imported & 1U) == 0)) && ((local_70->exported & 1U) == 0)) {
      _Var3 = std::__atomic_base::operator_cast_to_unsigned_int((__atomic_base *)&local_70->read);
      _Var4 = std::__atomic_base::operator_cast_to_unsigned_int
                        ((__atomic_base *)&local_70->readOnlyToWrite);
      local_7d = _Var3 == _Var4;
      _Var3 = std::__atomic_base::operator_cast_to_unsigned_int((__atomic_base *)&local_70->written)
      ;
      _Var4 = std::__atomic_base::operator_cast_to_unsigned_int
                        ((__atomic_base *)&local_70->readOnlyToWrite);
      if (_Var3 < _Var4) {
        __assert_fail("info.written >= info.readOnlyToWrite",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyGlobals.cpp"
                      ,0x241,"bool wasm::SimplifyGlobals::removeUnneededWrites()");
      }
      _Var3 = std::__atomic_base::operator_cast_to_unsigned_int((__atomic_base *)&local_70->read);
      if (((_Var3 == 0) ||
          (bVar2 = std::atomic::operator_cast_to_bool((atomic *)&local_70->nonInitWritten), !bVar2))
         || ((local_7d & 1) != 0)) {
        pGVar5 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                           ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)info);
        pVar6 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::insert
                          ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                           &__range2,(value_type *)pGVar5);
        local_90 = (_Base_ptr)pVar6.first._M_node;
        local_88 = pVar6.second;
        pGVar5 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                           ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)info);
        pGVar5->mutable_ = false;
        std::__atomic_base<unsigned_int>::operator=
                  (&(local_70->written).super___atomic_base<unsigned_int>,0);
        if ((local_7d & 1) != 0) {
          globalsNotNeedingSets._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

bool removeUnneededWrites() {
    bool more = false;

    // Globals that are not exports and not read from do not need their sets.
    // Likewise, globals that only write their initial value later also do not
    // need those writes. And, globals that are only read from in order to write
    // to themselves as well. First, find such globals.
    NameSet globalsNotNeedingSets;
    for (auto& global : module->globals) {
      auto& info = map[global->name];

      if (!info.written) {
        // No writes occur here, so there is nothing for us to remove.
        continue;
      }

      if (info.imported || info.exported) {
        // If the global is observable from the outside, we can't do anythng
        // here.
        //
        // TODO: optimize the case of an imported but immutable global, etc.
        continue;
      }

      // We only ever optimize read-only-to-write if all of our reads are done
      // in places we identified as read-only-to-write. That is, we have
      // eliminated the possibility of any other uses. (Technically, each
      // read-to-write location might have more than one read since we did not
      // count them, but only verified there was one read or more; but this is
      // good enough as the common case has exactly one.)
      //
      // Note that there might be more writes, if there are additional writes
      // besides those in the read-only-to-write locations. But we can ignore
      // those, as whatever they write will not be read in order to do anything
      // of value.
      bool onlyReadOnlyToWrite = (info.read == info.readOnlyToWrite);

      // There is at least one write in each read-only-to-write location, unless
      // our logic is wrong somewhere.
      assert(info.written >= info.readOnlyToWrite);

      if (!info.read || !info.nonInitWritten || onlyReadOnlyToWrite) {
        globalsNotNeedingSets.insert(global->name);

        // We can now mark this global as immutable, and un-written, since we
        // are about to remove all the sets on it.
        global->mutable_ = false;
        info.written = 0;

        // Nested only-read-to-write expressions require another full iteration
        // to optimize, as we have:
        //
        //   if (a) {
        //     a = 1;
        //     if (b) {
        //       b = 1;
        //     }
        //   }
        //
        // The first iteration can only optimize b, as the outer if's body has
        // more effects than we understand. After finishing the first iteration,
        // b will no longer exist, removing those effects.
        //
        // TODO: In principle other situations exist as well where more
        //       iterations help, like if we remove a set that turns something
        //       into a read-only-to-write.
        if (onlyReadOnlyToWrite) {
          more = true;
        }
      }
    }

    // Remove all the sets on the unnecessary globals. Later optimizations can
    // then see that since the global has no writes, it is a constant, which
    // will lead to removal of gets, and after removing them, the global itself
    // will be removed as well.
    GlobalSetRemover(&globalsNotNeedingSets, optimize)
      .run(getPassRunner(), module);

    return more;
  }